

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio.c
# Opt level: O2

size_t fwrite(void *__ptr,size_t __size,size_t __n,FILE *__s)

{
  int iVar1;
  size_t sVar2;
  size_t i;
  size_t sVar3;
  
  if (__size == 0 || __n == 0) {
    sVar2 = 0;
  }
  else {
    sVar3 = 0;
    while ((sVar2 = __n, __n != sVar3 &&
           (iVar1 = _Write((FILE *)__s,__ptr,__size), sVar2 = sVar3, -1 < iVar1))) {
      sVar3 = sVar3 + 1;
      __ptr = (void *)((long)__ptr + __size);
    }
  }
  return sVar2;
}

Assistant:

size_t fwrite(const void *restrict buffer, size_t size, size_t count, FILE *restrict stream) {
    if (count == 0 || size == 0) {
        return 0;
    }

    const unsigned char *const b = buffer;
    for (size_t i = 0; i < count; ++i) {
        if (_Write(stream, b + i * size, size) < 0) {
            return i;
        }
    }

    return count;
}